

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::OrderedTargetDependSet::OrderedTargetDependSet
          (OrderedTargetDependSet *this,TargetDependSet *targets,string *first)

{
  allocator_type local_59;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  char local_48 [8];
  undefined8 uStack_40;
  TargetCompare local_38;
  
  std::__cxx11::string::string((string *)&local_58,(string *)first);
  local_38.First._M_dataplus._M_p = (pointer)&local_38.First.field_2;
  if (local_58 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48) {
    local_38.First.field_2._8_8_ = uStack_40;
  }
  else {
    local_38.First._M_dataplus._M_p = (pointer)local_58;
  }
  local_38.First._M_string_length = local_50;
  local_50 = 0;
  local_48[0] = '\0';
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_48;
  std::
  multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  ::multiset(&this->
              super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
             ,&local_38,&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::
  _Rb_tree<cmTargetDepend,cmTargetDepend,std::_Identity<cmTargetDepend>,cmGlobalGhsMultiGenerator::TargetCompare,std::allocator<cmTargetDepend>>
  ::_M_insert_range_equal<std::_Rb_tree_const_iterator<cmTargetDepend>>
            ((_Rb_tree<cmTargetDepend,cmTargetDepend,std::_Identity<cmTargetDepend>,cmGlobalGhsMultiGenerator::TargetCompare,std::allocator<cmTargetDepend>>
              *)this,(targets->
                     super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     )._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<cmTargetDepend>)
             &(targets->
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)
              ._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

cmGlobalGhsMultiGenerator::OrderedTargetDependSet::OrderedTargetDependSet(
  TargetDependSet const& targets, std::string const& first)
  : derived(TargetCompare(first))
{
  this->insert(targets.begin(), targets.end());
}